

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_Expression_x_iutest_x_Bitwise_Test::Body(iu_Expression_x_iutest_x_Bitwise_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_530;
  AssertionHelper local_510;
  Fixed local_4e0;
  int local_354;
  int local_350;
  ExpressionDecomposer local_349;
  ExpressionLHS<int> local_348;
  ExpressionLHS<int> local_320;
  AssertionResult local_2f8;
  undefined1 local_2d0 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_288;
  Fixed local_258;
  int local_bc;
  int local_b8;
  ExpressionDecomposer local_b1;
  ExpressionLHS<int> local_b0;
  ExpressionLHS<int> local_88;
  AssertionResult local_60;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Expression_x_iutest_x_Bitwise_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_b8 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_b0,&local_b1,&local_b8);
  local_bc = 2;
  iutest::detail::ExpressionLHS<int>::operator&<int>(&local_88,&local_b0,&local_bc);
  iutest::detail::ExpressionLHS<int>::GetResult(&local_60,&local_88,true);
  iutest::AssertionResult::Is((AssertionResult *)local_38,&local_60);
  iutest::AssertionResult::~AssertionResult(&local_60);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_88);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_b0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_258,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_258);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_1.m_result,(internal *)local_38,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() & 2))","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x47,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_288,&local_258);
    iutest::AssertionHelper::~AssertionHelper(&local_288);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_258);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_350 = z();
  iutest::detail::ExpressionDecomposer::operator->*(&local_348,&local_349,&local_350);
  local_354 = 1;
  iutest::detail::ExpressionLHS<int>::operator|<int>(&local_320,&local_348,&local_354);
  iutest::detail::ExpressionLHS<int>::GetResult(&local_2f8,&local_320,true);
  iutest::AssertionResult::Is((AssertionResult *)local_2d0,&local_2f8);
  iutest::AssertionResult::~AssertionResult(&local_2f8);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_320);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_348);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    memset(&local_4e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_4e0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_530,(internal *)local_2d0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((z() | 1))","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x48,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_510,&local_4e0);
    iutest::AssertionHelper::~AssertionHelper(&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    iutest::AssertionHelper::Fixed::~Fixed(&local_4e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  return;
}

Assistant:

IUTEST(Expression, Bitwise)
{
    IUTEST_EXPECT(f() & 2);
    IUTEST_EXPECT(z() | 1);
}